

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week3-app2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  FancyInteger local_38;
  Integer local_34;
  FancyInteger f;
  Integer local_2c;
  Integer k;
  Integer A;
  Integer z;
  Integer j;
  Integer i;
  float F;
  char **argv_local;
  int argc_local;
  
  Integer::Integer(&z,5);
  Integer::Integer(&A,3);
  Integer::Integer(&k,'Z');
  Integer::Integer(&local_2c,&z);
  Integer::operator=(&local_2c,&A);
  Integer::print(&k);
  Integer::print(&z);
  Integer::Integer(&local_34,&A);
  operator+(&f.super_Integer,&z);
  Integer::print(&f.super_Integer);
  poVar1 = std::operator<<((ostream *)&std::cout,"i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,z.value);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"j=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,A.value);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  FancyInteger::Integer(&local_38,1);
  FancyInteger::print_fancy(&local_38);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    auto F = 3.14f;

//    auto a = 555i; // Integer(555) // possible with user defined literals

//    Integer i(5);
    auto i = Integer(5);

//    Integer j(3);
    auto j = Integer(3);

//    Integer z('Z');
    auto z = Integer('Z');

    //Integer A(i); // this is copy construction
    auto A = Integer(i);
    // ...
    // ...
    A = j; // copy assignment

    z.print();
    i.print(); //OOP style

//    Integer k = operator+(i, j);
//    Integer k = i + j;
    auto k = i + j;
    k.print();
    std::cout << "i=" << i.value << std::endl;
    std::cout << "j=" << j.value << std::endl;

//    FancyInteger f(1);
    auto f = FancyInteger(1);
    f.print_fancy();

//    operator<<(std::cout, "Hello");
//    std::cout << "Hello";

    return 0;
}